

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

int side2_8d_filter(double *p0,double *p1,double *p2,double *q0,double *q1)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  
  dVar13 = p0[2];
  dVar40 = p0[3];
  dVar45 = p0[4];
  dVar32 = p0[5];
  dVar28 = p0[6];
  dVar36 = p0[7];
  dVar35 = q0[2] - dVar13;
  dVar30 = q0[3] - dVar40;
  dVar26 = q0[4] - dVar45;
  dVar19 = q0[5] - dVar32;
  dVar41 = q0[6] - dVar28;
  dVar21 = *p0;
  dVar50 = p0[1];
  dVar10 = *q0 - dVar21;
  dVar18 = q0[1] - dVar50;
  dVar1 = ABS(dVar18);
  if (ABS(dVar18) <= ABS(dVar10)) {
    dVar1 = ABS(dVar10);
  }
  dVar7 = ABS(dVar35);
  if (ABS(dVar35) <= dVar1) {
    dVar7 = dVar1;
  }
  dVar1 = ABS(dVar30);
  if (ABS(dVar30) <= dVar7) {
    dVar1 = dVar7;
  }
  dVar7 = ABS(dVar26);
  if (ABS(dVar26) <= dVar1) {
    dVar7 = dVar1;
  }
  dVar1 = ABS(dVar19);
  if (ABS(dVar19) <= dVar7) {
    dVar1 = dVar7;
  }
  dVar7 = ABS(dVar41);
  if (ABS(dVar41) <= dVar1) {
    dVar7 = dVar1;
  }
  dVar1 = q0[7] - dVar36;
  dVar33 = ABS(dVar1);
  if (ABS(dVar1) <= dVar7) {
    dVar33 = dVar7;
  }
  dVar11 = *q1 - dVar21;
  dVar7 = ABS(dVar11);
  if (ABS(dVar11) <= dVar33) {
    dVar7 = dVar33;
  }
  dVar33 = p1[4] - dVar45;
  dVar42 = p1[3] - dVar40;
  dVar43 = q1[1] - dVar50;
  auVar22._0_8_ = ABS(dVar42);
  auVar22._8_8_ = ABS(dVar43);
  auVar23._8_4_ = SUB84(dVar7,0);
  auVar23._0_8_ = ABS(dVar33);
  auVar23._12_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar23 = maxpd(auVar22,auVar23);
  dVar31 = p1[7] - dVar36;
  dVar34 = q1[2] - dVar13;
  auVar15._0_8_ = ABS(dVar31);
  auVar15._8_8_ = ABS(dVar34);
  auVar23 = maxpd(auVar15,auVar23);
  dVar7 = p1[1] - dVar50;
  dVar2 = q1[6] - dVar28;
  dVar51 = p1[2] - dVar13;
  dVar52 = q1[5] - dVar32;
  dVar48 = p1[5] - dVar32;
  dVar49 = q1[7] - dVar36;
  dVar37 = p1[6] - dVar28;
  dVar38 = q1[4] - dVar45;
  dVar44 = q1[3] - dVar40;
  dVar27 = *p1 - dVar21;
  auVar24._0_8_ = ABS(dVar27);
  auVar24._8_8_ = ABS(dVar44);
  auVar23 = maxpd(auVar24,auVar23);
  auVar16._0_8_ = ABS(dVar37);
  auVar16._8_8_ = ABS(dVar38);
  auVar23 = maxpd(auVar16,auVar23);
  auVar25._0_8_ = ABS(dVar51);
  auVar25._8_8_ = ABS(dVar52);
  auVar23 = maxpd(auVar25,auVar23);
  auVar17._0_8_ = ABS(dVar7);
  auVar17._8_8_ = ABS(dVar2);
  auVar23 = maxpd(auVar17,auVar23);
  auVar8._0_8_ = ABS(dVar48);
  auVar8._8_8_ = ABS(dVar49);
  auVar23 = maxpd(auVar8,auVar23);
  dVar6 = auVar23._0_8_;
  dVar9 = auVar23._8_8_;
  dVar12 = dVar9;
  dVar20 = dVar6;
  if ((dVar9 <= dVar6) && (dVar20 = dVar9, dVar9 < dVar6)) {
    dVar12 = dVar6;
  }
  iVar3 = 0;
  iVar5 = 0;
  if ((1.1554293109153009e-147 <= dVar20) && (iVar5 = iVar3, dVar12 <= 1.8707220957835553e+50)) {
    dVar20 = dVar31 * dVar1 +
             dVar37 * dVar41 +
             dVar48 * dVar19 +
             dVar33 * dVar26 + dVar42 * dVar30 + dVar51 * dVar35 + dVar27 * dVar10 + dVar7 * dVar18;
    dVar39 = dVar31 * dVar49 +
             dVar37 * dVar2 +
             dVar48 * dVar52 +
             dVar33 * dVar38 + dVar42 * dVar44 + dVar51 * dVar34 + dVar27 * dVar11 + dVar7 * dVar43;
    dVar20 = dVar20 + dVar20;
    dVar39 = dVar39 + dVar39;
    dVar12 = dVar39 - dVar20;
    dVar47 = dVar6 * dVar9 * 1.6667009016668223e-14;
    iVar3 = 1;
    if ((dVar47 < dVar12) || (iVar3 = -1, dVar12 < -dVar47)) {
      dVar21 = *p2 - dVar21;
      dVar50 = p2[1] - dVar50;
      dVar13 = p2[2] - dVar13;
      dVar40 = p2[3] - dVar40;
      dVar45 = p2[4] - dVar45;
      dVar32 = p2[5] - dVar32;
      dVar28 = p2[6] - dVar28;
      dVar36 = p2[7] - dVar36;
      dVar47 = dVar6;
      if (dVar6 <= dVar9) {
        dVar47 = dVar9;
      }
      dVar29 = ABS(dVar45);
      if (ABS(dVar45) <= dVar9) {
        dVar29 = dVar9;
      }
      dVar9 = ABS(dVar13);
      if (ABS(dVar13) <= dVar29) {
        dVar9 = dVar29;
      }
      dVar29 = ABS(dVar21);
      if (ABS(dVar21) <= dVar9) {
        dVar29 = dVar9;
      }
      dVar9 = ABS(dVar50);
      if (ABS(dVar50) <= dVar29) {
        dVar9 = dVar29;
      }
      dVar29 = ABS(dVar40);
      if (ABS(dVar40) <= dVar9) {
        dVar29 = dVar9;
      }
      dVar9 = ABS(dVar32);
      if (ABS(dVar32) <= dVar29) {
        dVar9 = dVar29;
      }
      dVar29 = ABS(dVar28);
      if (ABS(dVar28) <= dVar9) {
        dVar29 = dVar9;
      }
      dVar9 = ABS(dVar36);
      if (ABS(dVar36) <= dVar29) {
        dVar9 = dVar29;
      }
      dVar29 = dVar9;
      if (dVar9 <= dVar47) {
        dVar29 = dVar47;
      }
      dVar47 = dVar29;
      dVar14 = dVar6;
      if ((dVar6 <= dVar29) && (dVar47 = dVar6, dVar6 < dVar29)) {
        dVar14 = dVar29;
      }
      dVar46 = dVar9;
      if (dVar47 <= dVar9) {
        dVar46 = dVar47;
      }
      if ((1.2641951066311592e-74 <= dVar46) && (dVar14 <= 1.8707220957835553e+50)) {
        dVar33 = dVar31 * dVar31 +
                 dVar37 * dVar37 +
                 dVar48 * dVar48 +
                 dVar33 * dVar33 +
                 dVar42 * dVar42 + dVar51 * dVar51 + dVar27 * dVar27 + dVar7 * dVar7;
        dVar7 = dVar6 * dVar9 * dVar9 * dVar29 * 8.711401122557855e-13;
        dVar13 = (dVar49 * dVar36 +
                 dVar2 * dVar28 +
                 dVar52 * dVar32 +
                 dVar38 * dVar45 +
                 dVar44 * dVar40 + dVar34 * dVar13 + dVar11 * dVar21 + dVar43 * dVar50) * -2.0 *
                 (dVar33 - dVar20) +
                 dVar12 * (dVar36 * dVar36 +
                          dVar28 * dVar28 +
                          dVar32 * dVar32 +
                          dVar45 * dVar45 +
                          dVar40 * dVar40 + dVar13 * dVar13 + dVar21 * dVar21 + dVar50 * dVar50) +
                 (dVar39 - dVar33) *
                 (dVar1 * dVar36 +
                 dVar41 * dVar28 +
                 dVar19 * dVar32 +
                 dVar26 * dVar45 +
                 dVar30 * dVar40 + dVar35 * dVar13 + dVar10 * dVar21 + dVar18 * dVar50) * -2.0;
        iVar4 = 1;
        if ((dVar7 < dVar13) || (iVar4 = -1, dVar13 < -dVar7)) {
          iVar5 = iVar4 * iVar3;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

inline int side2_8d_filter( const double* p0, const double* p1, const double* p2, const double* q0, const double* q1) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double l1;
    l1 = (1 * ((((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)) + (p1_7_p0_7 * p1_7_p0_7)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double p2_7_p0_7 = (p2[7] - p0[7]);
    double l2;
    l2 = (1 * ((((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)) + (p2_7_p0_7 * p2_7_p0_7)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    double a10;
    a10 = (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double q1_7_p0_7 = (q1[7] - p0[7]);
    double a11;
    a11 = (2 * ((((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)) + (p1_7_p0_7 * q1_7_p0_7)));
    double a20;
    a20 = (2 * ((((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)) + (p2_7_p0_7 * q0_7_p0_7)));
    double a21;
    a21 = (2 * ((((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)) + (p2_7_p0_7 * q1_7_p0_7)));
    double Delta;
    Delta = (a11 - a10);
    double DeltaLambda0;
    DeltaLambda0 = (a11 - l1);
    double DeltaLambda1;
    DeltaLambda1 = (l1 - a10);
    double r;
    r = (((Delta * l2) - (a20 * DeltaLambda0)) - (a21 * DeltaLambda1));
    double eps;
    double max1 = fabs(p1_4_p0_4);
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_7_p0_7)) )
    {
        max1 = fabs(p1_7_p0_7);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    double max2 = fabs(q0_0_p0_0);
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    if( (max2 < fabs(q0_7_p0_7)) )
    {
        max2 = fabs(q0_7_p0_7);
    } 
    if( (max2 < fabs(q1_0_p0_0)) )
    {
        max2 = fabs(q1_0_p0_0);
    } 
    if( (max2 < fabs(q1_1_p0_1)) )
    {
        max2 = fabs(q1_1_p0_1);
    } 
    if( (max2 < fabs(q1_2_p0_2)) )
    {
        max2 = fabs(q1_2_p0_2);
    } 
    if( (max2 < fabs(q1_3_p0_3)) )
    {
        max2 = fabs(q1_3_p0_3);
    } 
    if( (max2 < fabs(q1_4_p0_4)) )
    {
        max2 = fabs(q1_4_p0_4);
    } 
    if( (max2 < fabs(q1_5_p0_5)) )
    {
        max2 = fabs(q1_5_p0_5);
    } 
    if( (max2 < fabs(q1_6_p0_6)) )
    {
        max2 = fabs(q1_6_p0_6);
    } 
    if( (max2 < fabs(q1_7_p0_7)) )
    {
        max2 = fabs(q1_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (lower_bound_1 < 1.15542931091530087067e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.87072209578355531992e+50) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66670090166682227006e-14 * (max1 * max2));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max3 = max2;
    if( (max3 < max1) )
    {
        max3 = max1;
    } 
    double max4 = max2;
    if( (max4 < fabs(p2_4_p0_4)) )
    {
        max4 = fabs(p2_4_p0_4);
    } 
    if( (max4 < fabs(p2_2_p0_2)) )
    {
        max4 = fabs(p2_2_p0_2);
    } 
    if( (max4 < fabs(p2_0_p0_0)) )
    {
        max4 = fabs(p2_0_p0_0);
    } 
    if( (max4 < fabs(p2_1_p0_1)) )
    {
        max4 = fabs(p2_1_p0_1);
    } 
    if( (max4 < fabs(p2_3_p0_3)) )
    {
        max4 = fabs(p2_3_p0_3);
    } 
    if( (max4 < fabs(p2_5_p0_5)) )
    {
        max4 = fabs(p2_5_p0_5);
    } 
    if( (max4 < fabs(p2_6_p0_6)) )
    {
        max4 = fabs(p2_6_p0_6);
    } 
    if( (max4 < fabs(p2_7_p0_7)) )
    {
        max4 = fabs(p2_7_p0_7);
    } 
    if( (max3 < max4) )
    {
        max3 = max4;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    if( (lower_bound_1 < 1.26419510663115923609e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.87072209578355531992e+50) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (8.71140112255785451890e-13 * (((max1 * max4) * max4) * max3));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}